

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void * compact_upto_thread(void *args)

{
  fdb_status fVar1;
  fdb_file_handle *in_RDI;
  fdb_file_handle *dbfile;
  fdb_config *fconfig;
  fdb_status status;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_config *in_stack_00000198;
  char *in_stack_000001a0;
  fdb_file_handle **in_stack_000001a8;
  uint64_t *in_stack_000010d8;
  fdb_snapshot_info_t **in_stack_000010e0;
  fdb_file_handle *in_stack_000010e8;
  fdb_file_handle *in_stack_ffffffffffffff78;
  fdb_file_handle *fhandle;
  undefined4 in_stack_ffffffffffffff88;
  long local_68;
  int local_5c;
  timeval local_18;
  fdb_file_handle *local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  fdb_open(in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
  fhandle = local_8;
  for (local_5c = 0; local_5c < 10; local_5c = local_5c + 1) {
    sleep(1);
    fVar1 = fdb_get_all_snap_markers(in_stack_000010e8,in_stack_000010e0,in_stack_000010d8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x219);
      compact_upto_thread::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x219,"void *compact_upto_thread(void *)");
      }
    }
    if (local_68 == 0) break;
    fVar1 = fdb_compact_upto(fhandle,(char *)in_stack_ffffffffffffff78,0x105547);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x21f);
      compact_upto_thread::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x21f,"void *compact_upto_thread(void *)");
      }
      fVar1 = FDB_RESULT_SUCCESS;
    }
    fdb_free_snap_markers
              ((fdb_snapshot_info_t *)CONCAT44(fVar1,in_stack_ffffffffffffff88),(uint64_t)fhandle);
  }
  fdb_close(in_stack_ffffffffffffff78);
  return (void *)0x0;
}

Assistant:

void *compact_upto_thread(void *args) {
    TEST_INIT();

    int i;
    uint64_t num_markers;
    fdb_snapshot_info_t *markers;
    fdb_status status;

    fdb_config *fconfig = (fdb_config *)args;
    fdb_file_handle *dbfile;
    fdb_open(&dbfile, E2EDB_MAIN, fconfig);
    for (i = 0; i < 10; ++i) {
        sleep(1);
        status = fdb_get_all_snap_markers(dbfile, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (num_markers == 0) {
            // No need of compaction as file is empty
            break;
        }
        status = fdb_compact_upto(dbfile, NULL, markers[0].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_free_snap_markers(markers, num_markers);
    }
    fdb_close(dbfile);
    return NULL;
}